

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CounterUnitTest.cpp
# Opt level: O3

bool TestAssignment(void)

{
  return true;
}

Assistant:

bool TestAssignment()
{
    TEST_CHECK(TestAssignmentF<Counter64>());
    TEST_CHECK(TestAssignmentF<Counter48>());
    TEST_CHECK(TestAssignmentF<Counter32>());
    TEST_CHECK(TestAssignmentF<Counter24>());
    TEST_CHECK(TestAssignmentF<Counter16>());
    TEST_CHECK(TestAssignmentF<Counter10>());
    TEST_CHECK(TestAssignmentF<Counter8>());
    TEST_CHECK(TestAssignmentF<Counter4>());
    return true;
}